

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isGatherOffsetsCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint coordZ;
  uint uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec2 local_38;
  
  fVar7 = TexVerifierUtil::computeFloatingPointError(coord->m_data[2],(prec->coordBits).m_data[2]);
  fVar8 = TexVerifierUtil::computeFixedPointError((prec->uvwBits).m_data[2]);
  fVar10 = coord->m_data[2];
  fVar9 = floorf((fVar10 - (fVar8 + fVar7)) + 0.5);
  uVar3 = (uint)fVar9;
  iVar1 = texture->m_numLevels;
  iVar6 = -1;
  coordZ = 0xffffffff;
  if (0 < iVar1) {
    coordZ = (texture->m_levels->m_size).m_data[2] - 1;
  }
  if ((int)uVar3 < (int)coordZ) {
    coordZ = uVar3;
  }
  uVar5 = 0;
  if ((int)uVar3 < 0) {
    coordZ = uVar5;
  }
  fVar10 = floorf(fVar8 + fVar7 + fVar10 + 0.5);
  iVar4 = (int)fVar10;
  if (0 < iVar1) {
    iVar6 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar4 < iVar6) {
    iVar6 = iVar4;
  }
  if (iVar4 < 0) {
    iVar6 = 0;
  }
  if ((int)coordZ <= iVar6) {
    do {
      local_38.m_data = *(float (*) [2])coord->m_data;
      bVar2 = isGatherOffsetsCompareResultValid
                        (texture->m_levels,sampler,prec,&local_38,coordZ,offsets,cmpReference,result
                        );
      uVar5 = (uint)bVar2;
      if (bVar2) break;
      coordZ = coordZ + 1;
    } while ((int)coordZ <= iVar6);
  }
  return SUB41(uVar5,0);
}

Assistant:

bool isGatherOffsetsCompareResultValid (const Texture2DArrayView&	texture,
										const Sampler&				sampler,
										const TexComparePrecision&	prec,
										const Vec3&					coord,
										const IVec2					(&offsets)[4],
										float						cmpReference,
										const Vec4&					result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		if (isGatherOffsetsCompareResultValid(texture.getLevel(0), sampler, prec, coord.swizzle(0,1), layer, offsets, cmpReference, result))
			return true;
	}
	return false;
}